

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

void __thiscall
pstore::serialize::archive::database_reader::get<pstore::uint128,void>
          (database_reader *this,uint128 *v)

{
  undefined8 uVar1;
  value_type vVar2;
  unique_pointer<const_pstore::uint128> result;
  
  vVar2 = (this->addr_).a_;
  vVar2 = (vVar2 + 0xf & 0xfffffffffffffff0) - vVar2;
  if (vVar2 < 0x10) {
    address::operator+=(&this->addr_,vVar2);
    database::getrou<pstore::uint128,void>
              ((database *)&result,(typed_address<pstore::uint128>)this->db_);
    address::operator+=(&this->addr_,0x10);
    uVar1 = *(undefined8 *)
             ((long)&(result._M_t.
                      super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>
                      .super__Head_base<0UL,_const_pstore::uint128_*,_false>._M_head_impl)->v_ + 8);
    *(long *)&v->v_ =
         (long)(result._M_t.
                super___uniq_ptr_impl<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>._M_t
                .super__Tuple_impl<0UL,_const_pstore::uint128_*,_void_(*)(const_pstore::uint128_*)>.
                super__Head_base<0UL,_const_pstore::uint128_*,_false>._M_head_impl)->v_;
    *(undefined8 *)((long)&v->v_ + 8) = uVar1;
    std::unique_ptr<const_pstore::uint128,_void_(*)(const_pstore::uint128_*)>::~unique_ptr(&result);
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }